

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketParser.cpp
# Opt level: O3

void __thiscall
PacketParser::subValues(PacketParser *this,int key,string *value,__ItemValueType value_type)

{
  float fVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ItemInfo **ppIVar6;
  ItemInfo *pIVar7;
  int *piVar8;
  UnsupportedOperationException *pUVar9;
  undefined8 uVar10;
  long lVar11;
  int *__nptr;
  float fVar12;
  string local_50;
  
  if (value_type == IVT_INT) {
    iVar2 = (this->data).m_size;
    lVar11 = (long)iVar2;
    ppIVar6 = (this->data).m_items;
    if (0 < lVar11) {
      lVar4 = 0;
      do {
        if ((ppIVar6[lVar4]->m_value).index == key) {
          pIVar7 = ppIVar6[lVar4];
          if (pIVar7 != (ItemInfo *)0x0) goto LAB_001052e2;
          break;
        }
        lVar4 = lVar4 + 1;
      } while (lVar11 != lVar4);
    }
    (this->data).m_size = iVar2 + 1;
    ppIVar6 = (ItemInfo **)realloc(ppIVar6,lVar11 * 8 + 8);
    (this->data).m_items = ppIVar6;
    pIVar7 = (ItemInfo *)operator_new(0x28);
    (pIVar7->super__Gen)._vptr__Gen = (_func_int **)&PTR__ItemInfo_00109b48;
    *(undefined8 *)&pIVar7->m_value = 0;
    (pIVar7->m_value).name = (char *)0x0;
    *(undefined8 *)&(pIVar7->m_value).type = 0;
    (pIVar7->m_value).field_3.eValue = 0.0;
    ppIVar6[(long)(this->data).m_size + -1] = pIVar7;
    (pIVar7->m_value).index = key;
LAB_001052e2:
    pIVar7 = ItemInfo::operator[](pIVar7,"value");
    iVar2 = (pIVar7->m_value).field_3.iValue;
    __nptr = (int *)(value->_M_dataplus)._M_p;
    piVar8 = __errno_location();
    iVar3 = *piVar8;
    *piVar8 = 0;
    lVar11 = strtol((char *)__nptr,(char **)&local_50,10);
    if ((int *)local_50._M_dataplus._M_p != __nptr) {
      if (((int)lVar11 == lVar11) && (*piVar8 != 0x22)) {
        if (*piVar8 == 0) {
          *piVar8 = iVar3;
        }
        iVar3 = (this->data).m_size;
        lVar4 = (long)iVar3;
        ppIVar6 = (this->data).m_items;
        if (0 < lVar4) {
          lVar5 = 0;
          do {
            if ((ppIVar6[lVar5]->m_value).index == key) {
              pIVar7 = ppIVar6[lVar5];
              if (pIVar7 != (ItemInfo *)0x0) goto LAB_0010552d;
              break;
            }
            lVar5 = lVar5 + 1;
          } while (lVar4 != lVar5);
        }
        (this->data).m_size = iVar3 + 1;
        ppIVar6 = (ItemInfo **)realloc(ppIVar6,lVar4 * 8 + 8);
        (this->data).m_items = ppIVar6;
        pIVar7 = (ItemInfo *)operator_new(0x28);
        (pIVar7->super__Gen)._vptr__Gen = (_func_int **)&PTR__ItemInfo_00109b48;
        *(undefined8 *)&pIVar7->m_value = 0;
        (pIVar7->m_value).name = (char *)0x0;
        *(undefined8 *)&(pIVar7->m_value).type = 0;
        (pIVar7->m_value).field_3.eValue = 0.0;
        ppIVar6[(long)(this->data).m_size + -1] = pIVar7;
        (pIVar7->m_value).index = key;
LAB_0010552d:
        pIVar7 = ItemInfo::operator[](pIVar7,"value");
        (*(pIVar7->super__Gen)._vptr__Gen[2])(pIVar7);
        (pIVar7->m_value).type = IVT_INT;
        (pIVar7->m_value).field_3.iValue = iVar2 - (int)lVar11;
        return;
      }
      goto LAB_00105635;
    }
    std::__throw_invalid_argument("stoi");
  }
  else {
    if (value_type != IVT_FLOAT) {
      if (value_type == IVT_STRING) {
        pUVar9 = (UnsupportedOperationException *)__cxa_allocate_exception(0x30);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Subtraction of strings is unsupported!","");
        UnsupportedOperationException::UnsupportedOperationException
                  (pUVar9,&local_50,(char)key,IVT_STRING);
        __cxa_throw(pUVar9,&UnsupportedOperationException::typeinfo,
                    UnsupportedOperationException::~UnsupportedOperationException);
      }
      pUVar9 = (UnsupportedOperationException *)__cxa_allocate_exception(0x30);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Unsupported substraction on unknown type.","");
      UnsupportedOperationException::UnsupportedOperationException
                (pUVar9,&local_50,(char)key,value_type);
      __cxa_throw(pUVar9,&UnsupportedOperationException::typeinfo,
                  UnsupportedOperationException::~UnsupportedOperationException);
    }
    iVar2 = (this->data).m_size;
    lVar11 = (long)iVar2;
    ppIVar6 = (this->data).m_items;
    if (0 < lVar11) {
      lVar4 = 0;
      do {
        if ((ppIVar6[lVar4]->m_value).index == key) {
          pIVar7 = ppIVar6[lVar4];
          if (pIVar7 != (ItemInfo *)0x0) goto LAB_001053cc;
          break;
        }
        lVar4 = lVar4 + 1;
      } while (lVar11 != lVar4);
    }
    (this->data).m_size = iVar2 + 1;
    ppIVar6 = (ItemInfo **)realloc(ppIVar6,lVar11 * 8 + 8);
    (this->data).m_items = ppIVar6;
    pIVar7 = (ItemInfo *)operator_new(0x28);
    (pIVar7->super__Gen)._vptr__Gen = (_func_int **)&PTR__ItemInfo_00109b48;
    *(undefined8 *)&pIVar7->m_value = 0;
    (pIVar7->m_value).name = (char *)0x0;
    *(undefined8 *)&(pIVar7->m_value).type = 0;
    (pIVar7->m_value).field_3.eValue = 0.0;
    ppIVar6[(long)(this->data).m_size + -1] = pIVar7;
    (pIVar7->m_value).index = key;
LAB_001053cc:
    pIVar7 = ItemInfo::operator[](pIVar7,"value");
    fVar1 = (pIVar7->m_value).field_3.fValue;
    __nptr = (int *)(value->_M_dataplus)._M_p;
    piVar8 = __errno_location();
    iVar2 = *piVar8;
    *piVar8 = 0;
    fVar12 = strtof((char *)__nptr,(char **)&local_50);
    if ((int *)local_50._M_dataplus._M_p != __nptr) {
      if (*piVar8 != 0) {
        if (*piVar8 != 0x22) goto LAB_0010542e;
        fVar12 = (float)std::__throw_out_of_range("stof");
      }
      *piVar8 = iVar2;
LAB_0010542e:
      iVar2 = (this->data).m_size;
      lVar11 = (long)iVar2;
      ppIVar6 = (this->data).m_items;
      if (0 < lVar11) {
        lVar4 = 0;
        do {
          if ((ppIVar6[lVar4]->m_value).index == key) {
            pIVar7 = ppIVar6[lVar4];
            if (pIVar7 != (ItemInfo *)0x0) goto LAB_001054af;
            break;
          }
          lVar4 = lVar4 + 1;
        } while (lVar11 != lVar4);
      }
      (this->data).m_size = iVar2 + 1;
      ppIVar6 = (ItemInfo **)realloc(ppIVar6,lVar11 * 8 + 8);
      (this->data).m_items = ppIVar6;
      pIVar7 = (ItemInfo *)operator_new(0x28);
      (pIVar7->super__Gen)._vptr__Gen = (_func_int **)&PTR__ItemInfo_00109b48;
      *(undefined8 *)&pIVar7->m_value = 0;
      (pIVar7->m_value).name = (char *)0x0;
      *(undefined8 *)&(pIVar7->m_value).type = 0;
      (pIVar7->m_value).field_3.eValue = 0.0;
      ppIVar6[(long)(this->data).m_size + -1] = pIVar7;
      (pIVar7->m_value).index = key;
LAB_001054af:
      pIVar7 = ItemInfo::operator[](pIVar7,"value");
      (*(pIVar7->super__Gen)._vptr__Gen[2])(pIVar7);
      (pIVar7->m_value).type = IVT_FLOAT;
      (pIVar7->m_value).field_3.fValue = fVar1 - fVar12;
      return;
    }
  }
  std::__throw_invalid_argument("stof");
LAB_00105635:
  uVar10 = std::__throw_out_of_range("stoi");
  if ((int *)local_50._M_dataplus._M_p != piVar8) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((char)__nptr != '\0') {
    __cxa_free_exception(this);
  }
  _Unwind_Resume(uVar10);
}

Assistant:

void	PacketParser::subValues(const int key, const std::string &value, const __ItemValueType value_type)
{
	if (value_type == IVT_INT)
	{
		int result = data[key]["value"].get_value().iValue - std::stoi(value);
		data[key]["value"] = result;
	}
	else if (value_type == IVT_FLOAT)
	{
		float result = data[key]["value"].get_value().fValue - std::stof(value);
		data[key]["value"] = result;
	}
	else if (value_type == IVT_STRING)
		throw UnsupportedOperationException("Subtraction of strings is unsupported!", key, value_type);
	else
		throw UnsupportedOperationException("Unsupported substraction on unknown type.", key, value_type);
}